

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaLinCon.cpp
# Opt level: O1

NaLinearControlKind StrToLinControlKindIO(char *s)

{
  int iVar1;
  NaLinearControlKind NVar2;
  undefined4 *puVar3;
  
  if (s != (char *)0x0) {
    iVar1 = strcmp("gain",s);
    if (iVar1 == 0) {
      NVar2 = lckGain;
    }
    else {
      iVar1 = strcmp("inertial",s);
      if (iVar1 == 0) {
        NVar2 = lckInertial;
      }
      else {
        iVar1 = strcmp("integral",s);
        if (iVar1 == 0) {
          NVar2 = lckIntegral;
        }
        else {
          iVar1 = strcmp("differential",s);
          if (iVar1 == 0) {
            NVar2 = lckDifferential;
          }
          else {
            iVar1 = strcmp("diffstatic",s);
            if (iVar1 == 0) {
              NVar2 = lckDiffStatic;
            }
            else {
              iVar1 = strcmp("oscillation",s);
              if (iVar1 == 0) {
                NVar2 = lckOscillation;
              }
              else {
                iVar1 = strcmp("conservative",s);
                if (iVar1 == 0) {
                  NVar2 = lckConservative;
                }
                else {
                  iVar1 = strcmp("delay",s);
                  NVar2 = __lckNumber - (iVar1 == 0);
                }
              }
            }
          }
        }
      }
    }
    return NVar2;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

NaLinearControlKind
StrToLinControlKindIO (const char* s)
{
    if(NULL == s)
        throw(na_null_pointer);

    if(!strcmp(LinControlKindToStrIO(lckGain), s))
        return lckGain;
    else if(!strcmp(LinControlKindToStrIO(lckInertial), s))
        return lckInertial;
    else if(!strcmp(LinControlKindToStrIO(lckIntegral), s))
        return lckIntegral;
    else if(!strcmp(LinControlKindToStrIO(lckDifferential), s))
        return lckDifferential;
    else if(!strcmp(LinControlKindToStrIO(lckDiffStatic), s))
        return lckDiffStatic;
    else if(!strcmp(LinControlKindToStrIO(lckOscillation), s))
        return lckOscillation;
    else if(!strcmp(LinControlKindToStrIO(lckConservative), s))
        return lckConservative;
    else if(!strcmp(LinControlKindToStrIO(lckDelay), s))
        return lckDelay;
    return __lckNumber;
}